

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

LPVOID MapViewOfFileEx(HANDLE hFileMappingObject,DWORD dwDesiredAccess,DWORD dwFileOffsetHigh,
                      DWORD dwFileOffsetLow,SIZE_T dwNumberOfBytesToMap,LPVOID lpBaseAddress)

{
  PAL_ERROR PVar1;
  CPalThread *pThread;
  PAL_ERROR *pPVar2;
  LPVOID local_38;
  LPVOID pvMappedBaseAddress;
  
  local_38 = (LPVOID)0x0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012dbfa;
  pThread = CorUnix::InternalGetCurrentThread();
  if (lpBaseAddress == (LPVOID)0x0) {
    PVar1 = CorUnix::InternalMapViewOfFile
                      (pThread,hFileMappingObject,dwDesiredAccess,dwFileOffsetHigh,dwFileOffsetLow,
                       dwNumberOfBytesToMap,&local_38);
    if (PVar1 != 0) goto LAB_0012dbd4;
  }
  else {
    PVar1 = 0x57;
LAB_0012dbd4:
    pPVar2 = (PAL_ERROR *)__errno_location();
    *pPVar2 = PVar1;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return local_38;
  }
LAB_0012dbfa:
  abort();
}

Assistant:

LPVOID
PALAPI
MapViewOfFileEx(
          IN HANDLE hFileMappingObject,
          IN DWORD dwDesiredAccess,
          IN DWORD dwFileOffsetHigh,
          IN DWORD dwFileOffsetLow,
          IN SIZE_T dwNumberOfBytesToMap,
          IN LPVOID lpBaseAddress)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread = NULL;
    LPVOID pvMappedBaseAddress = NULL;

    PERF_ENTRY(MapViewOfFileEx);
    ENTRY("MapViewOfFileEx(hFileMapping=%p, dwDesiredAccess=%u, "
          "dwFileOffsetH=%u, dwFileOffsetL=%u, dwNumberOfBytes=%u, lpBaseAddress=%p)\n",
          hFileMappingObject, dwDesiredAccess, dwFileOffsetHigh,
          dwFileOffsetLow, dwNumberOfBytesToMap, lpBaseAddress);

    pThread = InternalGetCurrentThread();

    if (lpBaseAddress == NULL)
    {
        palError = InternalMapViewOfFile(
            pThread,
            hFileMappingObject,
            dwDesiredAccess,
            dwFileOffsetHigh,
            dwFileOffsetLow,
            dwNumberOfBytesToMap,
            &pvMappedBaseAddress
            );

        if (NO_ERROR != palError)
        {
            pThread->SetLastError(palError);
        }
    }
    else
    {
        // TODO: Figure out if we can support mapping at a specific address on Linux.
        pThread->SetLastError(ERROR_INVALID_PARAMETER);       
    }

    LOGEXIT( "MapViewOfFileEx returning %p.\n", pvMappedBaseAddress );
    PERF_EXIT(MapViewOfFileEx);
    return pvMappedBaseAddress;
}